

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pmVar5;
  pointer pfVar6;
  undefined1 auVar7 [16];
  longdouble *plVar8;
  int *piVar9;
  rc_data *prVar10;
  subsolver_type *psVar11;
  bound_factor *pbVar12;
  undefined8 extraout_RAX;
  pointer *ppfVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  subsolver_type sVar19;
  pointer pfVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  size_t max_z_constraints;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar23 = (ulong)(this->ap).m_rows_values.m_length;
  uVar16 = uVar23 << 4;
  plVar8 = (longdouble *)operator_new__(uVar16);
  memset(plVar8,0,uVar16);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar8;
  uVar23 = uVar23 << 2;
  piVar9 = (int *)operator_new__(uVar23);
  memset(piVar9,0,uVar23);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar9;
  pmVar5 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (long)*(pointer *)
                  ((long)&(pmVar5->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar5->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  lVar14 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar5;
  if (lVar14 != 0x28) {
    lVar14 = (lVar14 >> 3) * -0x3333333333333333 + -1;
    ppfVar13 = (pointer *)
               ((long)&pmVar5[1].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    do {
      uVar23 = (long)*ppfVar13 - (long)((_Vector_impl_data *)(ppfVar13 + -1))->_M_start >> 3;
      if (uVar16 <= uVar23) {
        uVar16 = uVar23;
      }
      ppfVar13 = ppfVar13 + 5;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  uVar16 = -(ulong)(uVar16 >> 0x3b != 0) | uVar16 << 5;
  prVar10 = (rc_data *)operator_new__(uVar16);
  memset(prVar10,0,uVar16);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
  ._M_head_impl = prVar10;
  uVar23 = (ulong)m_;
  psVar11 = (subsolver_type *)operator_new__(uVar23);
  memset(psVar11,0,uVar23);
  (this->Z)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_false>
  ._M_head_impl = psVar11;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar23;
  uVar16 = SUB168(auVar7 * ZEXT816(0xc),0);
  if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pbVar12 = (bound_factor *)operator_new__(uVar16);
  memset(pbVar12,0,uVar16);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
  ._M_head_impl = pbVar12;
  uVar23 = uVar23 << 4;
  if (m_ < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  plVar8 = (longdouble *)operator_new__(uVar23);
  memset(plVar8,0,uVar23);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar8;
  iVar24 = 0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  auVar25 = ZEXT432(0) << 0x40;
  (this->bb).items =
       (vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
        )auVar25._0_24_;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar25._24_8_;
  *(undefined1 (*) [32])
   &(this->bb).items.
    super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar25;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auVar26 = ZEXT464(0) << 0x40;
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
        )auVar26._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar26._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._56_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  uVar16 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar23 = 0;
  max_z_constraints = 0;
  if ((int)uVar16 != 0) {
    uVar21 = 0;
    max_z_constraints = 0;
    uVar23 = 0;
    do {
      psVar11 = (this->Z)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_false>
                ._M_head_impl;
      psVar11[uVar21] = linear;
      pmVar5 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar20 = *(pointer *)
                 &pmVar5[uVar21].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar6 = *(pointer *)
                ((long)&pmVar5[uVar21].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar20 == pfVar6) {
        uVar15 = 0;
        iVar17 = 0;
        iVar18 = 0;
      }
      else {
        piVar9 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl + iVar24;
        lVar14 = 0;
        iVar18 = 0;
        iVar17 = 0;
        do {
          if (pfVar20->factor == 0) {
            itm::solver_inequalities_Zcoeff();
            goto LAB_005b964e;
          }
          *piVar9 = pfVar20->factor;
          uVar2 = pfVar20->factor;
          uVar22 = 0;
          if ((int)uVar2 < 0) {
            uVar22 = uVar2;
          }
          if (uVar2 - 2 < 0xfffffffd) {
            psVar11[uVar21] = branch_and_bound;
          }
          iVar17 = iVar17 + (~((int)uVar2 >> 0x1f) & uVar2);
          iVar18 = iVar18 + uVar22;
          pfVar20 = pfVar20 + 1;
          piVar9 = piVar9 + 1;
          lVar14 = lVar14 + -1;
        } while (pfVar20 != pfVar6);
        iVar24 = iVar24 - (int)lVar14;
        uVar15 = -lVar14;
      }
      if (psVar11[uVar21] == branch_and_bound && uVar15 < 10) {
        psVar11[uVar21] = exhaustive;
      }
      pmVar5 = pmVar5 + uVar21;
      iVar3 = pmVar5->min;
      iVar4 = pmVar5->max;
      if (iVar3 == iVar4) {
        pbVar12 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        pbVar12[uVar21].min = iVar3;
        iVar17 = iVar4;
      }
      else {
        if ((iVar3 <= iVar18) || (iVar17 <= iVar4)) {
          if (psVar11[uVar21] == branch_and_bound) {
            sVar19 = unconstrained_branch_and_bound;
          }
          else {
            if (psVar11[uVar21] != exhaustive) goto LAB_005b957e;
            sVar19 = unconstrained_exhaustive;
          }
          psVar11[uVar21] = sVar19;
        }
LAB_005b957e:
        if (iVar3 < iVar18) {
          iVar3 = iVar18;
        }
        pbVar12 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        pbVar12[uVar21].min = iVar3;
        if (pmVar5->max < iVar17) {
          iVar17 = pmVar5->max;
        }
      }
      pbVar12[uVar21].max = iVar17;
      if (uVar15 < uVar23) {
        uVar15 = uVar23;
      }
      uVar23 = uVar15;
      if ((psVar11[uVar21] | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
        pbVar12 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::
        build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                  ((exhaustive_solver<baryonyx::itm::maximize_tag,long_double> *)&this->ex,
                   (int)uVar21,&pmVar5->elements,pbVar12[uVar21].min,pbVar12[uVar21].max);
        max_z_constraints = max_z_constraints + 1;
      }
      pbVar12 = (this->b)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                ._M_head_impl;
      if (pbVar12[uVar21].max < pbVar12[uVar21].min) {
LAB_005b964e:
        itm::solver_inequalities_Zcoeff();
        pbVar12 = (this->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                  ._M_head_impl;
        if (pbVar12 != (bound_factor *)0x0) {
          operator_delete__(pbVar12);
        }
        (this->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        psVar11 = (this->Z)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_false>
                  ._M_head_impl;
        if (psVar11 != (subsolver_type *)0x0) {
          operator_delete__(psVar11);
        }
        (this->Z)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type_*,_false>
        ._M_head_impl = (subsolver_type *)0x0;
        prVar10 = (this->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                  ._M_head_impl;
        if (prVar10 != (rc_data *)0x0) {
          operator_delete__(prVar10);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar9 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar9 != (int *)0x0) {
          operator_delete__(piVar9);
        }
        (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        plVar8 = (this->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        if (plVar8 != (longdouble *)0x0) {
          operator_delete__(plVar8);
        }
        (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
        super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
        super__Head_base<0UL,_long_double_*,_false>._M_head_impl = (longdouble *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uVar16 & 0xffffffff));
  }
  if (max_z_constraints != 0) {
    exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::reserve
              (&this->ex,uVar23,max_z_constraints);
  }
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
  ::reserve(&(this->bb).items,uVar23);
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve
            ((vector<signed_char,_std::allocator<signed_char>_> *)&this->bb,uVar23 << 10);
  return;
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }